

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_decoder.cc
# Opt level: O0

bool __thiscall draco::MetadataDecoder::DecodeName(MetadataDecoder *this,string *name)

{
  bool bVar1;
  ulong in_RSI;
  DecoderBuffer *in_RDI;
  uint8_t name_len;
  uchar *in_stack_ffffffffffffffd0;
  
  bVar1 = DecoderBuffer::Decode<unsigned_char>(in_RDI,in_stack_ffffffffffffffd0);
  if (bVar1) {
    std::__cxx11::string::resize(in_RSI);
  }
  return bVar1;
}

Assistant:

bool MetadataDecoder::DecodeName(std::string *name) {
  uint8_t name_len = 0;
  if (!buffer_->Decode(&name_len)) {
    return false;
  }
  name->resize(name_len);
  if (name_len == 0) {
    return true;
  }
  if (!buffer_->Decode(&name->at(0), name_len)) {
    return false;
  }
  return true;
}